

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

BDD sylvan_serialize_get_reversed(size_t value)

{
  int iVar1;
  sylvan_ser *psVar2;
  sylvan_ser *ss;
  sylvan_ser s;
  size_t value_local;
  
  s.assigned = value;
  iVar1 = sylvan_isnode(value);
  if (iVar1 == 0) {
    value_local = s.assigned;
  }
  else {
    s.bdd = MTBDD_STRIPMARK(s.assigned);
    psVar2 = sylvan_ser_reversed_search(sylvan_ser_reversed_set,(sylvan_ser *)&ss);
    if (psVar2 == (sylvan_ser *)0x0) {
      __assert_fail("ss != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                    ,0x8b8,"BDD sylvan_serialize_get_reversed(size_t)");
    }
    value_local = MTBDD_TRANSFERMARK(s.assigned,psVar2->bdd);
  }
  return value_local;
}

Assistant:

BDD
sylvan_serialize_get_reversed(size_t value)
{
    if (!sylvan_isnode(value)) return value;
    struct sylvan_ser s, *ss;
    s.assigned = BDD_STRIPMARK(value);
    ss = sylvan_ser_reversed_search(sylvan_ser_reversed_set, &s);
    assert(ss != NULL);
    return BDD_TRANSFERMARK(value, ss->bdd);
}